

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::FileLog(FileLog *this,string *path,SessionID *s)

{
  string local_90;
  string local_70 [32];
  string local_50 [48];
  SessionID *local_20;
  SessionID *s_local;
  string *path_local;
  FileLog *this_local;
  
  local_20 = s;
  s_local = (SessionID *)path;
  path_local = (string *)this;
  Log::Log(&this->super_Log);
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_0032f9d0;
  std::ofstream::ofstream(&this->m_messages);
  std::ofstream::ofstream(&this->m_event);
  std::__cxx11::string::string((string *)&this->m_messagesFileName);
  std::__cxx11::string::string((string *)&this->m_eventFileName);
  std::__cxx11::string::string((string *)&this->m_fullPrefix);
  std::__cxx11::string::string((string *)&this->m_fullBackupPrefix);
  std::__cxx11::string::string(local_50,(string *)s_local);
  std::__cxx11::string::string(local_70,(string *)s_local);
  generatePrefix_abi_cxx11_(&local_90,this,local_20);
  init(this,(EVP_PKEY_CTX *)local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

FileLog::FileLog(const std::string &path, const SessionID &s) { init(path, path, generatePrefix(s)); }